

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::write<char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,char value,format_specs *specs,locale_ref loc)

{
  uint uVar1;
  loc_value value_00;
  bool bVar2;
  basic_appender<char> bVar3;
  byte bVar4;
  anon_class_2_2_bf5026b7 local_38;
  undefined2 uStack_36;
  undefined4 uStack_34;
  undefined8 uStack_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined8 uStack_20;
  
  uVar1 = (specs->super_basic_specs).data_;
  bVar4 = (byte)uVar1 & 7;
  if ((bVar4 < 8) && ((0x83U >> (uVar1 & 7) & 1) != 0)) {
    if (((uVar1 & 0x38) == 0x20) || ((uVar1 & 0x2c00) != 0)) {
      report_error("invalid format specifier for char");
    }
    if ((bVar4 < 8) && ((0x83U >> bVar4 & 1) != 0)) {
      local_38.is_debug = (uVar1 & 7) == 1;
      local_38.value = value;
      bVar3 = write_padded<char,(fmt::v11::align)1,fmt::v11::basic_appender<char>,fmt::v11::detail::write_char<char,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,char,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                        (out,specs,1,1,&local_38);
      return (basic_appender<char>)bVar3.container;
    }
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    local_38.value = '\0';
    uStack_36 = 0;
    local_28 = 2;
    value_00.value_.value_.field_0.int_value._1_3_ = 0;
    value_00.value_.value_.field_0.char_value = value;
    value_00.value_.value_.field_0.long_long_value._4_4_ = uStack_34;
    value_00.value_._20_4_ = uStack_24;
    value_00.value_.type_ = 2;
    value_00.value_.value_.field_0.string.size = uStack_30;
    value_00.value_._24_8_ = uStack_20;
    local_38.is_debug = (bool)value;
    bVar2 = write_loc((appender)out.container,value_00,specs,loc);
    if (bVar2) {
      return (basic_appender<char>)out.container;
    }
  }
  bVar3 = write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_int>
                    (out,(write_int_arg<unsigned_int>)
                         ((ulong)(byte)value |
                         (ulong)*(uint *)((long)&DAT_0045ce30 +
                                         (ulong)((specs->super_basic_specs).data_ >> 8 & 0xc)) <<
                         0x20),specs);
  return (basic_appender<char>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value, const format_specs& specs,
                         locale_ref loc = {}) -> OutputIt {
  // char is formatted as unsigned char for consistency across platforms.
  using unsigned_type =
      conditional_t<std::is_same<Char, char>::value, unsigned char, unsigned>;
  return check_char_specs(specs)
             ? write_char<Char>(out, value, specs)
             : write<Char>(out, static_cast<unsigned_type>(value), specs, loc);
}